

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall
QRasterPaintEnginePrivate::initializeRasterizer(QRasterPaintEnginePrivate *this,QSpanData *data)

{
  QPaintEngineState *pQVar1;
  QClipData *pQVar2;
  QPaintEngineState *pQVar3;
  ProcessSpans blend;
  long in_FS_OFFSET;
  QRect QVar4;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = ((this->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
  pQVar3 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar3 = (QPaintEngineState *)0x0;
  }
  QRasterizer::setAntialiased
            ((this->rasterizer).d,
             SUB41(((ushort)pQVar3[0x105].dirtyFlags.
                            super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                            super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) >> 3,0));
  local_38.x1.m_i = (this->deviceRect).x1.m_i;
  local_38.y1.m_i = (this->deviceRect).y1.m_i;
  local_38.x2.m_i = (this->deviceRect).x2.m_i;
  local_38.y2.m_i = (this->deviceRect).y2.m_i;
  pQVar2 = clip(this);
  QVar4.x2.m_i = local_38.x2.m_i;
  QVar4.y2.m_i = local_38.y2.m_i;
  QVar4.x1.m_i = local_38.x1.m_i;
  QVar4.y1.m_i = local_38.y1.m_i;
  if (pQVar2 == (QClipData *)0x0) {
    blend = data->unclipped_blend;
  }
  else {
    local_44 = pQVar2->ymin;
    local_48 = pQVar2->xmin;
    local_40 = pQVar2->xmax + -1;
    local_3c = pQVar2->ymax + -1;
    QVar4 = (QRect)QRect::operator&(&local_38,(QRect *)&local_48);
    blend = data->blend;
  }
  local_38 = QVar4;
  QRasterizer::setClipRect((this->rasterizer).d,&local_38);
  QRasterizer::initialize((this->rasterizer).d,blend,data);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEnginePrivate::initializeRasterizer(QSpanData *data)
{
    Q_Q(QRasterPaintEngine);
    QRasterPaintEngineState *s = q->state();

    rasterizer->setAntialiased(s->flags.antialiased);

    QRect clipRect(deviceRect);
    ProcessSpans blend;
    // ### get from optimized rectbased QClipData

    const QClipData *c = clip();
    if (c) {
        const QRect r(QPoint(c->xmin, c->ymin),
                      QSize(c->xmax - c->xmin, c->ymax - c->ymin));
        clipRect = clipRect.intersected(r);
        blend = data->blend;
    } else {
        blend = data->unclipped_blend;
    }

    rasterizer->setClipRect(clipRect);
    rasterizer->initialize(blend, data);
}